

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O1

int f(int h,int m,uint *I2_start,uint *I2_end)

{
  int iVar1;
  int R;
  uint uVar2;
  uint uVar3;
  
  iVar1 = 0;
  uVar2 = 0;
  if (-1 < m) {
    uVar3 = 0;
    do {
      uVar2 = uVar3 + m >> 1;
      if (I2_start[uVar2] < (uint)h) {
        uVar3 = uVar2 + 1;
      }
      else {
        if (I2_start[uVar2] <= (uint)h) break;
        m = uVar2 - 1;
      }
      uVar2 = uVar3;
    } while ((int)uVar3 <= m);
  }
  if ((uVar2 != 0) && ((h - 1U < I2_start[uVar2 - 1] || (iVar1 = 1, I2_end[uVar2 - 1] < h + 1U)))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int f(int h, int m, unsigned int* I2_start, unsigned int* I2_end)
{
    int i;
    i = first_geq(I2_start, m, h);
    if (i<1)
        return 0;
    int z = ceil(double(I2_end[i-1]-I2_start[i-1])/2);
    z = 1;
    if (I2_start[i-1]<=h-z && I2_end[i-1]>=h+z)
        return 1;
    return 0;
}